

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,
                       ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  uint8_t *q;
  uint8_t *q_00;
  int iVar1;
  uint8_t priv [32];
  uint8_t auStack_58 [40];
  
  if (peerkey.len == 0x20) {
    q = (uint8_t *)malloc(0x20);
    if (q != (uint8_t *)0x0) {
      ptls_minicrypto_random_bytes(auStack_58,0x20);
      cf_curve25519_mul_base(q,auStack_58);
      q_00 = (uint8_t *)malloc(0x20);
      secret->base = q_00;
      if (q_00 == (uint8_t *)0x0) {
        iVar1 = 0x201;
      }
      else {
        cf_curve25519_mul(q_00,auStack_58,peerkey.base);
        secret->len = 0x20;
        pubkey->base = q;
        pubkey->len = 0x20;
        iVar1 = 0;
      }
      goto LAB_0012450c;
    }
    iVar1 = 0x201;
  }
  else {
    iVar1 = 0x33;
  }
  q = (uint8_t *)0x0;
LAB_0012450c:
  (*ptls_clear_memory)(auStack_58,0x20);
  if (iVar1 != 0 && q != (uint8_t *)0x0) {
    (*ptls_clear_memory)(q,0x20);
  }
  return iVar1;
}

Assistant:

static int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret,
                               ptls_iovec_t peerkey)
{
    uint8_t priv[X25519_KEY_SIZE], *pub = NULL;
    int ret;

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(X25519_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    x25519_create_keypair(priv, pub);
    if ((ret = x25519_derive_secret(secret, NULL, peerkey.base, priv, pub)) != 0)
        goto Exit;

    *pubkey = ptls_iovec_init(pub, X25519_KEY_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (pub != NULL && ret != 0)
        ptls_clear_memory(pub, X25519_KEY_SIZE);
    return ret;
}